

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NeuralNetworkPreprocessing::SharedDtor(NeuralNetworkPreprocessing *this)

{
  bool bVar1;
  Arena *pAVar2;
  LogMessage *other;
  string *default_value;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  NeuralNetworkPreprocessing *local_10;
  NeuralNetworkPreprocessing *this_local;
  
  local_10 = this;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  local_49 = 0;
  if (pAVar2 != (Arena *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x13e8);
    local_49 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->featurename_,default_value);
  bVar1 = has_preprocessor(this);
  if (bVar1) {
    clear_preprocessor(this);
  }
  return;
}

Assistant:

inline void NeuralNetworkPreprocessing::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  featurename_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (has_preprocessor()) {
    clear_preprocessor();
  }
}